

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

SmallString<256U> * __thiscall
llvm::sys::path::remove_dots
          (SmallString<256U> *__return_storage_ptr__,path *this,StringRef path,bool remove_dot_dot,
          Style style)

{
  const_iterator x;
  const_iterator y;
  StringRef path_00;
  bool bVar1;
  bool bVar2;
  reference pSVar3;
  reference pSVar4;
  size_t sVar5;
  SmallString<256U> *pSVar6;
  Style style_00;
  Style SVar8;
  undefined7 in_register_00000081;
  StringRef SVar9;
  StringRef path_01;
  StringRef path_02;
  undefined4 in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9dc;
  Twine local_598;
  Twine local_580;
  Twine local_568;
  Twine local_550;
  undefined1 local_538 [8];
  StringRef C_1;
  iterator __end2_1;
  iterator __begin2_1;
  SmallVector<llvm::StringRef,_16U> *__range2_1;
  Twine local_4e8;
  char *local_4d0;
  char *local_4c0;
  size_t local_4b8;
  char *local_4b0;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_480;
  char *local_478;
  undefined1 local_470 [8];
  StringRef C;
  const_iterator __end2;
  const_iterator __begin2;
  const_iterator local_3f0;
  path *local_3c0;
  char *local_3b8;
  const_iterator local_3b0;
  iterator_range<llvm::sys::path::const_iterator> local_380;
  iterator_range<llvm::sys::path::const_iterator> *local_320;
  iterator_range<llvm::sys::path::const_iterator> *__range2;
  char *local_310;
  undefined1 local_308 [8];
  StringRef rel;
  SmallVector<llvm::StringRef,_16U> components;
  Style style_local;
  bool remove_dot_dot_local;
  StringRef path_local;
  SmallString<256U> *buffer;
  char *local_138;
  size_t local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  size_t *local_c8;
  size_t *local_c0;
  size_t *local_b8;
  char **local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  int local_7c;
  char **local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  int local_44;
  char **local_40;
  char *local_38;
  size_t local_30;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  ulong uVar7;
  
  path_local.Data = path.Data;
  style_00 = (Style)CONCAT71(in_register_00000081,remove_dot_dot);
  pSVar6 = __return_storage_ptr__;
  SVar8 = style_00;
  _style_local = (iterator_range<llvm::sys::path::const_iterator> *)this;
  path_local.Length = (size_t)__return_storage_ptr__;
  SmallVector<llvm::StringRef,_16U>::SmallVector((SmallVector<llvm::StringRef,_16U> *)&rel.Length);
  __range2 = _style_local;
  local_310 = path_local.Data;
  SVar9.Length._0_4_ = style_00;
  SVar9.Data = path_local.Data;
  SVar9.Length._4_4_ = 0;
  _local_308 = relative_path((path *)_style_local,SVar9,(Style)pSVar6);
  local_3c0 = (path *)local_308;
  local_3b8 = rel.Data;
  path_01.Length._0_4_ = style_00;
  path_01.Data = rel.Data;
  path_01.Length._4_4_ = 0;
  uVar7 = CONCAT71(in_register_00000081,remove_dot_dot) & 0xffffffff;
  begin(&local_3b0,(path *)local_308,path_01,SVar8);
  path_02.Length = uVar7;
  path_02.Data = rel.Data;
  end(&local_3f0,(path *)local_308,path_02);
  x.Path.Length = (size_t)local_3b0.Component.Data;
  x.Path.Data = (char *)local_3b0.Path.Length;
  x.Component.Data = (char *)local_3b0.Component.Length;
  x.Component.Length = local_3b0.Position;
  x.Position = local_3b0._40_8_;
  x._40_8_ = local_3f0.Path.Data;
  y.Path.Length = (size_t)local_3f0.Component.Data;
  y.Path.Data = (char *)local_3f0.Path.Length;
  y.Component.Data = (char *)local_3f0.Component.Length;
  y.Component.Length = local_3f0.Position;
  y.Position = local_3f0._40_8_;
  y.S = in_stack_fffffffffffff9d8;
  y._44_4_ = in_stack_fffffffffffff9dc;
  make_range<llvm::sys::path::const_iterator>(x,y);
  local_320 = &local_380;
  iterator_range<llvm::sys::path::const_iterator>::begin((const_iterator *)&__end2.S,local_320);
  iterator_range<llvm::sys::path::const_iterator>::end((const_iterator *)&C.Length,local_320);
  do {
    bVar1 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
            ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                          *)&__end2.S,(const_iterator *)&C.Length);
    if (!bVar1) {
      path_00.Length = (size_t)path_local.Data;
      path_00.Data = (char *)_style_local;
      SVar9 = root_path(path_00,style_00);
      SmallString<256U>::SmallString(__return_storage_ptr__,SVar9);
      local_c8 = &rel.Length;
      __end2_1 = (iterator)rel.Length;
      local_c0 = local_c8;
      local_b8 = local_c8;
      sVar5 = SmallVectorBase::size((SmallVectorBase *)local_c8);
      C_1.Length = rel.Length + sVar5 * 0x10;
      for (; __end2_1 != (iterator)C_1.Length; __end2_1 = __end2_1 + 1) {
        local_538 = (undefined1  [8])__end2_1->Data;
        C_1.Data = (char *)__end2_1->Length;
        SVar8 = style_00;
        Twine::Twine(&local_550,(StringRef *)local_538);
        Twine::Twine(&local_568,"");
        Twine::Twine(&local_580,"");
        Twine::Twine(&local_598,"");
        append((SmallVectorImpl<char> *)__return_storage_ptr__,SVar8,&local_550,&local_568,
               &local_580,&local_598);
      }
      SmallVector<llvm::StringRef,_16U>::~SmallVector
                ((SmallVector<llvm::StringRef,_16U> *)&rel.Length);
      return __return_storage_ptr__;
    }
    pSVar3 = const_iterator::operator*((const_iterator *)&__end2.S);
    local_480 = pSVar3->Data;
    local_478 = (char *)pSVar3->Length;
    local_490 = ".";
    local_470 = (undefined1  [8])local_480;
    C.Data = local_478;
    local_f0 = (char *)strlen(".");
    local_d8 = local_480;
    local_d0 = local_478;
    local_e8 = local_490;
    local_f8 = local_490;
    local_a8 = local_490;
    local_b0 = &local_d8;
    bVar1 = false;
    local_e0 = local_f0;
    local_a0 = local_f0;
    if (local_478 == local_f0) {
      local_88 = local_480;
      local_90 = local_490;
      local_98 = local_f0;
      if (local_f0 == (char *)0x0) {
        local_7c = 0;
      }
      else {
        local_7c = memcmp(local_480,local_490,(size_t)local_f0);
      }
      bVar1 = local_7c == 0;
    }
    if (!bVar1) {
      bVar1 = false;
      if (((undefined1  [16])path & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        local_4a0 = (char *)local_470;
        local_498 = C.Data;
        local_4b0 = "..";
        local_120 = (char *)strlen("..");
        local_108 = local_4a0;
        local_100 = local_498;
        local_118 = local_4b0;
        local_128 = local_4b0;
        local_70 = local_4b0;
        local_78 = &local_108;
        bVar1 = false;
        local_110 = local_120;
        local_68 = local_120;
        if (local_498 == local_120) {
          local_50 = local_4a0;
          local_58 = local_4b0;
          local_60 = local_120;
          if (local_120 == (char *)0x0) {
            local_44 = 0;
          }
          else {
            local_44 = memcmp(local_4a0,local_4b0,(size_t)local_120);
          }
          bVar1 = local_44 == 0;
        }
      }
      if (bVar1) {
        bVar2 = SmallVectorBase::empty((SmallVectorBase *)&rel.Length);
        bVar1 = false;
        if (!bVar2) {
          pSVar4 = SmallVectorTemplateCommon<llvm::StringRef,_void>::back
                             ((SmallVectorTemplateCommon<llvm::StringRef,_void> *)&rel.Length);
          local_4c0 = pSVar4->Data;
          local_4b8 = pSVar4->Length;
          local_4d0 = "..";
          local_30 = strlen("..");
          local_138 = local_4c0;
          local_130 = local_4b8;
          local_38 = local_4d0;
          local_40 = &local_138;
          bVar1 = false;
          if (local_4b8 == local_30) {
            local_18 = local_4c0;
            local_20 = local_4d0;
            local_28 = local_30;
            if (local_30 == 0) {
              local_c = 0;
            }
            else {
              local_c = memcmp(local_4c0,local_4d0,local_30);
            }
            bVar1 = local_c == 0;
          }
          bVar1 = (bool)(bVar1 ^ 1);
        }
        if (bVar1) {
          SmallVectorTemplateBase<llvm::StringRef,_true>::pop_back
                    ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&rel.Length);
        }
        else {
          Twine::Twine(&local_4e8,(StringRef *)&style_local);
          bVar1 = is_absolute(&local_4e8,style_00);
          if (!bVar1) goto LAB_0021b734;
        }
      }
      else {
LAB_0021b734:
        SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                  ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&rel.Length,
                   (StringRef *)local_470);
      }
    }
    const_iterator::operator++((const_iterator *)&__end2.S);
  } while( true );
}

Assistant:

static SmallString<256> remove_dots(StringRef path, bool remove_dot_dot,
                                    Style style) {
  SmallVector<StringRef, 16> components;

  // Skip the root path, then look for traversal in the components.
  StringRef rel = path::relative_path(path, style);
  for (StringRef C :
       llvm::make_range(path::begin(rel, style), path::end(rel))) {
    if (C == ".")
      continue;
    // Leading ".." will remain in the path unless it's at the root.
    if (remove_dot_dot && C == "..") {
      if (!components.empty() && components.back() != "..") {
        components.pop_back();
        continue;
      }
      if (path::is_absolute(path, style))
        continue;
    }
    components.push_back(C);
  }

  SmallString<256> buffer = path::root_path(path, style);
  for (StringRef C : components)
    path::append(buffer, style, C);
  return buffer;
}